

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestPoolEdgesReadyButNotWanted::Run(BuildTestPoolEdgesReadyButNotWanted *this)

{
  Test *this_00;
  int iVar1;
  Pool *this_01;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  State save_state;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  char *local_78;
  char *manifest;
  string local_68;
  allocator<char> local_31;
  string local_30;
  BuildTestPoolEdgesReadyButNotWanted *local_10;
  BuildTestPoolEdgesReadyButNotWanted *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"x",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"",(allocator<char> *)((long)&manifest + 7));
  VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&manifest + 7));
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  local_78 = 
  "pool some_pool\n  depth = 4\nrule touch\n  command = touch $out\n  pool = some_pool\nrule cc\n  command = touch grit\n\nbuild B.d.stamp: cc | x\nbuild C.stamp: touch B.d.stamp\nbuild final.stamp: touch || C.stamp\n"
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"final.stamp",&local_99);
  BuildTest::RebuildTarget
            (&this->super_BuildTest,&local_98,local_78,(char *)0x0,(char *)0x0,(State *)0x0);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"B.d.stamp",
             (allocator<char> *)
             ((long)&save_state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  VirtualFileSystem::RemoveFile(&(this->super_BuildTest).fs_,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&save_state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  State::State((State *)local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"final.stamp",&local_1f1);
  BuildTest::RebuildTarget
            (&this->super_BuildTest,&local_1f0,local_78,(char *)0x0,(char *)0x0,(State *)local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  this_00 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"some_pool",&local_219);
  this_01 = State::LookupPool((State *)local_1d0,&local_218);
  iVar1 = Pool::current_use(this_01);
  testing::Test::Check
            (this_00,(bool)((byte)~(byte)((uint)iVar1 >> 0x18) >> 7),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x5a8,"save_state.LookupPool(\"some_pool\")->current_use() >= 0");
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  State::~State((State *)local_1d0);
  return;
}

Assistant:

TEST_F(BuildTest, PoolEdgesReadyButNotWanted) {
  fs_.Create("x", "");

  const char* manifest =
    "pool some_pool\n"
    "  depth = 4\n"
    "rule touch\n"
    "  command = touch $out\n"
    "  pool = some_pool\n"
    "rule cc\n"
    "  command = touch grit\n"
    "\n"
    "build B.d.stamp: cc | x\n"
    "build C.stamp: touch B.d.stamp\n"
    "build final.stamp: touch || C.stamp\n";

  RebuildTarget("final.stamp", manifest);

  fs_.RemoveFile("B.d.stamp");

  State save_state;
  RebuildTarget("final.stamp", manifest, NULL, NULL, &save_state);
  EXPECT_GE(save_state.LookupPool("some_pool")->current_use(), 0);
}